

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

void __thiscall Patch::Node::set_new_text(Node *this,optional<Text> *text)

{
  bool bVar1;
  Text *this_00;
  Text *pTVar2;
  unique_ptr<Text,_std::default_delete<Text>_> local_20;
  optional<Text> *local_18;
  optional<Text> *text_local;
  Node *this_local;
  
  local_18 = text;
  text_local = (optional<Text> *)this;
  bVar1 = ::optional::operator_cast_to_bool((optional *)text);
  if (bVar1) {
    this_00 = (Text *)operator_new(0x38);
    pTVar2 = optional<Text>::operator*(local_18);
    Text::Text(this_00,pTVar2);
    std::unique_ptr<Text,std::default_delete<Text>>::unique_ptr<std::default_delete<Text>,void>
              ((unique_ptr<Text,std::default_delete<Text>> *)&local_20,this_00);
    std::unique_ptr<Text,_std::default_delete<Text>_>::operator=(&this->new_text,&local_20);
    std::unique_ptr<Text,_std::default_delete<Text>_>::~unique_ptr(&local_20);
  }
  else {
    std::unique_ptr<Text,_std::default_delete<Text>_>::operator=(&this->new_text,(nullptr_t)0x0);
  }
  return;
}

Assistant:

void set_new_text(optional<Text> &&text) {
    if (text) {
      new_text = unique_ptr<Text>{new Text{move(*text)}};
    } else {
      new_text = nullptr;
    }
  }